

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::GetKeyBirthTimes
          (CWallet *this,
          map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
          *mapKeyBirth)

{
  int64_t iVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  Chain *pCVar5;
  FoundBlock *pFVar6;
  LegacyScriptPubKeyMan *pLVar7;
  reference ppVar8;
  size_type sVar9;
  mapped_type *ppTVar10;
  TxStateConfirmed *pTVar11;
  pointer ppVar12;
  reference ppVar13;
  time_t tVar14;
  mapped_type *pmVar15;
  long in_FS_OFFSET;
  pair<const_CKeyID,_const_wallet::TxStateConfirmed_*> *entry_2;
  map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
  *__range1;
  CKeyID *keyid_1;
  vector<CKeyID,_std::allocator<CKeyID>_> *__range5;
  CTxOut *txout;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range4;
  TxStateConfirmed *conf;
  CWalletTx *wtx;
  value_type *entry_1;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *__range2_2;
  CKeyID *keyid;
  set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *__range2_1;
  pair<const_CKeyID,_wallet::CKeyMetadata> *entry;
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  *__range2;
  LegacyScriptPubKeyMan *spk_man;
  int64_t block_time;
  iterator __end1;
  iterator __begin1;
  iterator rit;
  iterator __end5;
  iterator __begin5;
  const_iterator __end4;
  const_iterator __begin4;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  iterator __end2_1;
  iterator __begin2_1;
  iterator __end2;
  iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock57;
  TxStateConfirmed max_confirm;
  map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
  mapKeyFirstBlock;
  int in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *in_stack_fffffffffffffc70;
  CWallet *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
  *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffca0;
  CScript *in_stack_fffffffffffffca8;
  TxStateConfirmed *in_stack_fffffffffffffcb0;
  uint in_stack_fffffffffffffcbc;
  iterator in_stack_fffffffffffffcc0;
  TxStateConfirmed *in_stack_fffffffffffffcc8;
  int local_2dc;
  long local_220;
  _Base_ptr local_218;
  _Base_ptr local_210;
  _Base_ptr local_208;
  _Base_ptr local_200;
  CKeyID *local_1f8;
  CKeyID *local_1f0;
  CTxOut *local_1d0;
  CTxOut *local_1c8;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_1c0;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_1b8;
  _Base_ptr local_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  byte local_189;
  FoundBlock local_188;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [48];
  undefined1 local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  TxStateConfirmed local_60 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc6c,(AnnotatedMixin<std::recursive_mutex> *)0x1b8cfb);
  std::map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::clear
            ((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
              *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  std::
  map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
  ::map((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
         *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  TxStateConfirmed::TxStateConfirmed
            ((TxStateConfirmed *)in_stack_fffffffffffffc78,(uint256 *)in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
  iVar4 = GetLastBlockHeight(in_stack_fffffffffffffc78);
  if (iVar4 < 0x91) {
    local_2dc = 0;
  }
  else {
    local_2dc = GetLastBlockHeight(in_stack_fffffffffffffc78);
    local_2dc = local_2dc + -0x90;
  }
  local_60[0].confirmed_block_height = local_2dc;
  pCVar5 = chain(in_stack_fffffffffffffc78);
  GetLastBlockHash(in_stack_fffffffffffffc78);
  iVar4 = local_60[0].confirmed_block_height;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  interfaces::FoundBlock::FoundBlock
            ((FoundBlock *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  pFVar6 = interfaces::FoundBlock::hash
                     ((FoundBlock *)in_stack_fffffffffffffc78,(uint256 *)in_stack_fffffffffffffc70);
  local_189 = (**(code **)(*(long *)pCVar5 + 0x60))(pCVar5,local_a8,iVar4,pFVar6);
  local_189 = local_189 & 1;
  inline_check_non_fatal<bool>
            ((bool *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0._M_node,
             in_stack_fffffffffffffcbc,(char *)in_stack_fffffffffffffcb0,
             (char *)in_stack_fffffffffffffca8);
  pLVar7 = GetLegacyScriptPubKeyMan
                     ((CWallet *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if (pLVar7 == (LegacyScriptPubKeyMan *)0x0) {
    __assert_fail("spk_man != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0xaca,"void wallet::CWallet::GetKeyBirthTimes(std::map<CKeyID, int64_t> &) const"
                 );
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffca8,
             in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc8c,SUB41((uint)in_stack_fffffffffffffc88 >> 0x18,0));
  local_198 = (_Base_ptr)
              std::
              map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
              ::begin((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                       *)in_stack_fffffffffffffc70);
  local_1a0 = (_Base_ptr)
              std::
              map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
              ::end((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                     *)in_stack_fffffffffffffc70);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffc78,
                                 (_Self *)in_stack_fffffffffffffc70), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_> *)
                        CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    if ((ppVar8->second).nCreateTime != 0) {
      iVar1 = (ppVar8->second).nCreateTime;
      pmVar15 = std::
                map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                ::operator[](in_stack_fffffffffffffc90,
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      *pmVar15 = iVar1;
    }
    std::_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  }
  (*(pLVar7->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x25])(local_d8);
  local_1a8 = (_Base_ptr)
              std::set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_>::begin
                        ((set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *)
                         in_stack_fffffffffffffc70);
  local_1b0 = (_Base_ptr)
              std::set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_>::end
                        ((set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *)
                         in_stack_fffffffffffffc70);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffc78,
                                 (_Self *)in_stack_fffffffffffffc70), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<CKeyID>::operator*
              ((_Rb_tree_const_iterator<CKeyID> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    sVar9 = std::
            map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
            count((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                   *)in_stack_fffffffffffffc78,(key_type *)in_stack_fffffffffffffc70);
    if (sVar9 == 0) {
      ppTVar10 = std::
                 map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                 ::operator[]((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                               *)in_stack_fffffffffffffc90,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      *ppTVar10 = local_60;
    }
    std::_Rb_tree_const_iterator<CKeyID>::operator++
              ((_Rb_tree_const_iterator<CKeyID> *)
               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  }
  std::set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_>::~set
            ((set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *)
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  bVar2 = std::
          map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
          ::empty((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  if (bVar2) {
    bVar2 = true;
  }
  else {
    local_1b8._M_cur =
         (__node_type *)
         std::
         unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         ::begin(in_stack_fffffffffffffc70);
    local_1c0._M_cur =
         (__node_type *)
         std::
         unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         ::end(in_stack_fffffffffffffc70);
    while (bVar2 = std::__detail::operator==
                             ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               *)in_stack_fffffffffffffc78,
                              (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               *)in_stack_fffffffffffffc70), ((bVar2 ^ 0xffU) & 1) != 0) {
      std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
      ::operator*((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                  CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      pTVar11 = CWalletTx::state<wallet::TxStateConfirmed>
                          ((CWalletTx *)
                           CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      in_stack_fffffffffffffcc8 = pTVar11;
      if (pTVar11 != (TxStateConfirmed *)0x0) {
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        local_1c8 = (CTxOut *)
                    std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
                              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffc70)
        ;
        local_1d0 = (CTxOut *)
                    std::vector<CTxOut,_std::allocator<CTxOut>_>::end
                              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffc70)
        ;
        while (bVar2 = __gnu_cxx::
                       operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                 ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                   *)in_stack_fffffffffffffc78,
                                  (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                   *)in_stack_fffffffffffffc70), ((bVar2 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
          operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                     *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          GetAffectedKeys(in_stack_fffffffffffffca8,(SigningProvider *)in_stack_fffffffffffffca0);
          local_1f0 = (CKeyID *)
                      std::vector<CKeyID,_std::allocator<CKeyID>_>::begin
                                ((vector<CKeyID,_std::allocator<CKeyID>_> *)
                                 in_stack_fffffffffffffc70);
          local_1f8 = (CKeyID *)
                      std::vector<CKeyID,_std::allocator<CKeyID>_>::end
                                ((vector<CKeyID,_std::allocator<CKeyID>_> *)
                                 in_stack_fffffffffffffc70);
          while (bVar2 = __gnu_cxx::
                         operator==<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                                   ((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                                     *)in_stack_fffffffffffffc78,
                                    (__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                                     *)in_stack_fffffffffffffc70), ((bVar2 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
            operator*((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *)
                      CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
            in_stack_fffffffffffffcc0 =
                 std::
                 map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                 ::find((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                         *)in_stack_fffffffffffffc70,
                        (key_type *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
            local_200 = in_stack_fffffffffffffcc0._M_node;
            local_208 = (_Base_ptr)
                        std::
                        map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                        ::end((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                               *)in_stack_fffffffffffffc70);
            bVar2 = std::operator==((_Self *)in_stack_fffffffffffffc78,
                                    (_Self *)in_stack_fffffffffffffc70);
            in_stack_fffffffffffffcbc = in_stack_fffffffffffffcbc & 0xffffff;
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              iVar4 = pTVar11->confirmed_block_height;
              ppVar12 = std::
                        _Rb_tree_iterator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>
                        ::operator->((_Rb_tree_iterator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>
                                      *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68
                                                ));
              in_stack_fffffffffffffcbc =
                   CONCAT13(iVar4 < ppVar12->second->confirmed_block_height,
                            (int3)in_stack_fffffffffffffcbc);
            }
            if ((char)(in_stack_fffffffffffffcbc >> 0x18) != '\0') {
              in_stack_fffffffffffffcb0 = pTVar11;
              ppVar12 = std::
                        _Rb_tree_iterator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>
                        ::operator->((_Rb_tree_iterator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>
                                      *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68
                                                ));
              ppVar12->second = in_stack_fffffffffffffcb0;
            }
            __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
            operator++((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *
                       )CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          }
          std::vector<CKeyID,_std::allocator<CKeyID>_>::~vector
                    ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffc78);
          __gnu_cxx::
          __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
          operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        }
      }
      std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *
                   )CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    }
    bVar2 = false;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  if (!bVar2) {
    local_210 = (_Base_ptr)
                std::
                map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                ::begin((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                         *)in_stack_fffffffffffffc70);
    local_218 = (_Base_ptr)
                std::
                map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                ::end((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
                       *)in_stack_fffffffffffffc70);
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffc78,
                                   (_Self *)in_stack_fffffffffffffc70), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      ppVar13 = std::_Rb_tree_iterator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>::
                operator*((_Rb_tree_iterator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>
                           *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      pCVar5 = chain(in_stack_fffffffffffffc78);
      pTVar11 = ppVar13->second;
      local_188.m_data = (CBlock *)0x0;
      local_188.found = false;
      local_188._73_7_ = 0;
      local_188.m_locator = (CBlockLocator *)0x0;
      local_188.m_next_block = (FoundBlock *)0x0;
      local_188.m_mtp_time = (int64_t *)0x0;
      local_188.m_in_active_chain = (bool *)0x0;
      local_188.m_time = (int64_t *)0x0;
      local_188.m_max_time = (int64_t *)0x0;
      local_188.m_hash = (uint256 *)0x0;
      local_188.m_height = (int *)0x0;
      pFVar6 = &local_188;
      interfaces::FoundBlock::FoundBlock
                ((FoundBlock *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      tVar14 = interfaces::FoundBlock::time(pFVar6,&local_220);
      uVar3 = (**(code **)(*(long *)pCVar5 + 0x50))(pCVar5,pTVar11,tVar14);
      in_stack_fffffffffffffc8c = CONCAT13(uVar3,(int3)in_stack_fffffffffffffc8c);
      inline_check_non_fatal<bool>
                ((bool *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0._M_node,
                 in_stack_fffffffffffffcbc,(char *)in_stack_fffffffffffffcb0,(char *)pCVar5);
      in_stack_fffffffffffffc78 = (CWallet *)(local_220 + -0x1c20);
      pmVar15 = std::
                map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                ::operator[]((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                              *)pTVar11,
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      *pmVar15 = (mapped_type)in_stack_fffffffffffffc78;
      std::_Rb_tree_iterator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_> *)
                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    }
  }
  std::
  map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
  ::~map((map<CKeyID,_const_wallet::TxStateConfirmed_*,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_const_wallet::TxStateConfirmed_*>_>_>
          *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::GetKeyBirthTimes(std::map<CKeyID, int64_t>& mapKeyBirth) const {
    AssertLockHeld(cs_wallet);
    mapKeyBirth.clear();

    // map in which we'll infer heights of other keys
    std::map<CKeyID, const TxStateConfirmed*> mapKeyFirstBlock;
    TxStateConfirmed max_confirm{uint256{}, /*height=*/-1, /*index=*/-1};
    max_confirm.confirmed_block_height = GetLastBlockHeight() > 144 ? GetLastBlockHeight() - 144 : 0; // the tip can be reorganized; use a 144-block safety margin
    CHECK_NONFATAL(chain().findAncestorByHeight(GetLastBlockHash(), max_confirm.confirmed_block_height, FoundBlock().hash(max_confirm.confirmed_block_hash)));

    {
        LegacyScriptPubKeyMan* spk_man = GetLegacyScriptPubKeyMan();
        assert(spk_man != nullptr);
        LOCK(spk_man->cs_KeyStore);

        // get birth times for keys with metadata
        for (const auto& entry : spk_man->mapKeyMetadata) {
            if (entry.second.nCreateTime) {
                mapKeyBirth[entry.first] = entry.second.nCreateTime;
            }
        }

        // Prepare to infer birth heights for keys without metadata
        for (const CKeyID &keyid : spk_man->GetKeys()) {
            if (mapKeyBirth.count(keyid) == 0)
                mapKeyFirstBlock[keyid] = &max_confirm;
        }

        // if there are no such keys, we're done
        if (mapKeyFirstBlock.empty())
            return;

        // find first block that affects those keys, if there are any left
        for (const auto& entry : mapWallet) {
            // iterate over all wallet transactions...
            const CWalletTx &wtx = entry.second;
            if (auto* conf = wtx.state<TxStateConfirmed>()) {
                // ... which are already in a block
                for (const CTxOut &txout : wtx.tx->vout) {
                    // iterate over all their outputs
                    for (const auto &keyid : GetAffectedKeys(txout.scriptPubKey, *spk_man)) {
                        // ... and all their affected keys
                        auto rit = mapKeyFirstBlock.find(keyid);
                        if (rit != mapKeyFirstBlock.end() && conf->confirmed_block_height < rit->second->confirmed_block_height) {
                            rit->second = conf;
                        }
                    }
                }
            }
        }
    }

    // Extract block timestamps for those keys
    for (const auto& entry : mapKeyFirstBlock) {
        int64_t block_time;
        CHECK_NONFATAL(chain().findBlock(entry.second->confirmed_block_hash, FoundBlock().time(block_time)));
        mapKeyBirth[entry.first] = block_time - TIMESTAMP_WINDOW; // block times can be 2h off
    }
}